

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> __thiscall
pbrt::Tokenizer::CreateFromString
          (Tokenizer *this,string *str,
          function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  Tokenizer *this_00;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  string local_48;
  
  this_00 = (Tokenizer *)operator_new(0x98);
  paVar1 = &str->field_2;
  local_48._M_dataplus._M_p = (str->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&str->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  local_58 = (_Manager_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = errorCallback->_M_invoker;
  p_Var2 = (errorCallback->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(errorCallback->super__Function_base)._M_functor;
    local_68._8_8_ = *(undefined8 *)((long)&(errorCallback->super__Function_base)._M_functor + 8);
    (errorCallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    errorCallback->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var2;
  }
  Tokenizer(this_00,&local_48,(function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_68);
  (this->loc).filename._M_len = (size_t)this_00;
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
         (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Tokenizer> Tokenizer::CreateFromString(
    std::string str, std::function<void(const char *, const FileLoc *)> errorCallback) {
    return std::make_unique<Tokenizer>(std::move(str), std::move(errorCallback));
}